

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall QGraphicsItem::scroll(QGraphicsItem *this,qreal dx,qreal dy,QRectF *rect)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  uint uVar4;
  QGraphicsScenePrivate *this_00;
  QGraphicsItemCache *item;
  ulong uVar5;
  QRectF *this_01;
  qsizetype qVar6;
  long lVar7;
  long lVar8;
  QRectF *in_RSI;
  QGraphicsItem *in_RDI;
  long in_FS_OFFSET;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  QRect *exposedRect;
  const_iterator __end1;
  const_iterator __begin1;
  QRegion *__range1;
  QRectF *e;
  int i;
  QGraphicsItemCache *cache;
  QGraphicsItemPrivate *d;
  QRegion exposed;
  QRect scrollRect;
  QPixmap cachedPixmap;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  QRect *in_stack_fffffffffffffed8;
  QSize *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  QGraphicsItemPrivate *in_stack_ffffffffffffff00;
  QRect *in_stack_ffffffffffffff08;
  reference in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff24;
  Key local_80;
  QPoint local_78;
  QPoint local_70;
  QRect local_68;
  QRegion local_58;
  qreal local_50;
  qreal local_48;
  qreal local_40;
  qreal local_38;
  undefined1 local_30 [16];
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QGraphicsScenePrivate *)d_func((QGraphicsItem *)0x98291a);
  auVar1._8_8_ = local_30._8_8_;
  auVar1._0_8_ = local_30._0_8_;
  if (((((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) || (in_XMM1_Qa != 0.0)) || (NAN(in_XMM1_Qa))) &&
     (local_30 = auVar1, (QGraphicsScene *)this_00->index != (QGraphicsScene *)0x0)) {
    if (((((uint)((ulong)(this_00->movingItemsInitialPositions).d >> 0x15) & 3) == 1) &&
        (bVar2 = qFuzzyIsNull((double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
        , bVar2)) &&
       (bVar2 = qFuzzyIsNull((double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8)),
       bVar2)) {
      item = QGraphicsItemPrivate::extraItemCache(in_stack_ffffffffffffff00);
      if (((item->allExposed & 1U) != 0) ||
         (bVar2 = QSize::isValid(in_stack_fffffffffffffee0), bVar2)) {
        update(in_RDI,(QRectF *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
      else {
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        QPixmap::QPixmap((QPixmap *)&local_20);
        uVar5 = QPixmapCache::find(&item->key,(QPixmap *)&local_20);
        if ((uVar5 & 1) == 0) {
          update(in_RDI,(QRectF *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        }
        else {
          local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
          bVar2 = QRectF::isNull(in_RSI);
          if (bVar2) {
            (*in_RDI->_vptr_QGraphicsItem[3])(&local_50);
          }
          else {
            local_50 = in_RSI->xp;
            local_48 = in_RSI->yp;
            local_40 = in_RSI->w;
            local_38 = in_RSI->h;
          }
          local_30 = QRectF::toAlignedRect();
          uVar5 = QRect::intersects((QRect *)local_30);
          if ((uVar5 & 1) != 0) {
            QPixmapCache::remove(&item->key);
            local_58.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
            QRegion::QRegion(&local_58);
            iVar3 = (int)in_XMM0_Qa;
            uVar4 = (uint)in_XMM1_Qa;
            local_78 = QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffecc,
                                                        in_stack_fffffffffffffec8));
            local_70 = ::operator-((QPoint *)
                                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
            local_68 = QRect::translated(in_stack_ffffffffffffff08,
                                         (QPoint *)in_stack_ffffffffffffff00);
            QPixmap::scroll((int)&local_20,iVar3,(QRect *)(ulong)uVar4,(QRegion *)&local_68);
            QPixmapCache::insert((QPixmap *)&local_80);
            QPixmapCache::Key::operator=
                      ((Key *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                       (Key *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            QPixmapCache::Key::~Key(&local_80);
            iVar3 = 0;
            while( true ) {
              this_01 = (QRectF *)(long)iVar3;
              qVar6 = QList<QRectF>::size(&item->exposed);
              if (qVar6 <= (long)this_01) break;
              in_stack_ffffffffffffff18 =
                   QList<QRectF>::operator[]
                             ((QList<QRectF> *)
                              CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                              CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
              bVar2 = QRectF::isNull(in_RSI);
              if (bVar2) {
LAB_00982c9c:
                QRectF::translate(in_stack_ffffffffffffff18,in_XMM0_Qa,in_XMM1_Qa);
              }
              else {
                uVar5 = QRectF::intersects((QRectF *)in_stack_ffffffffffffff18);
                if ((uVar5 & 1) != 0) goto LAB_00982c9c;
              }
              iVar3 = iVar3 + 1;
            }
            QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            QRegion::translate((QRegion *)this_01,(QPoint *)in_stack_fffffffffffffed8);
            lVar7 = QRegion::begin();
            lVar8 = QRegion::end();
            for (; lVar7 != lVar8; lVar7 = lVar7 + 0x10) {
              QRectF::QRectF(this_01,in_stack_fffffffffffffed8);
              QList<QRectF>::operator+=
                        ((QList<QRectF> *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                         (rvalue_ref)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
            }
            QGraphicsScene::d_func((QGraphicsScene *)0x982d94);
            QGraphicsScenePrivate::markDirty
                      (this_00,(QGraphicsItem *)item,
                       (QRectF *)CONCAT44(in_stack_ffffffffffffff24,iVar3),
                       SUB81((ulong)in_stack_ffffffffffffff18 >> 0x38,0),
                       SUB81((ulong)in_stack_ffffffffffffff18 >> 0x30,0),
                       SUB81((ulong)in_stack_ffffffffffffff18 >> 0x28,0),
                       SUB81((ulong)in_stack_ffffffffffffff18 >> 0x20,0),
                       SUB81((ulong)in_stack_ffffffffffffff18 >> 0x18,0));
            QRegion::~QRegion(&local_58);
          }
        }
        QPixmap::~QPixmap((QPixmap *)&local_20);
      }
    }
    else {
      update(in_RDI,(QRectF *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItem::scroll(qreal dx, qreal dy, const QRectF &rect)
{
    Q_D(QGraphicsItem);
    if (dx == 0.0 && dy == 0.0)
        return;
    if (!d->scene)
        return;

    // Accelerated scrolling means moving pixels from one location to another
    // and only redraw the newly exposed area. The following requirements must
    // be fulfilled in order to do that:
    //
    // 1) Item is opaque.
    // 2) Item is not overlapped by other items.
    //
    // There's (yet) no way to detect whether an item is opaque or not, which means
    // we cannot do accelerated scrolling unless the cache is enabled. In case of using
    // DeviceCoordinate cache we also have to take the device transform into account in
    // order to determine whether we can do accelerated scrolling or not. That's left out
    // for simplicity here, but it is definitely something we can consider in the future
    // as a performance improvement.
    if (d->cacheMode != QGraphicsItem::ItemCoordinateCache
        || !qFuzzyIsNull(dx - int(dx)) || !qFuzzyIsNull(dy - int(dy))) {
        update(rect);
        return;
    }

    QGraphicsItemCache *cache = d->extraItemCache();
    if (cache->allExposed || cache->fixedSize.isValid()) {
        // Cache is either invalidated or item is scaled (see QGraphicsItem::setCacheMode).
        update(rect);
        return;
    }

    // Find pixmap in cache.
    QPixmap cachedPixmap;
    if (!QPixmapCache::find(cache->key, &cachedPixmap)) {
        update(rect);
        return;
    }

    QRect scrollRect = (rect.isNull() ? boundingRect() : rect).toAlignedRect();
    if (!scrollRect.intersects(cache->boundingRect))
        return; // Nothing to scroll.

    // Remove from cache to avoid deep copy when modifying.
    QPixmapCache::remove(cache->key);

    QRegion exposed;
    cachedPixmap.scroll(dx, dy, scrollRect.translated(-cache->boundingRect.topLeft()), &exposed);

    // Reinsert into cache.
    cache->key = QPixmapCache::insert(cachedPixmap);

    // Translate the existing expose.
    for (int i = 0; i < cache->exposed.size(); ++i) {
        QRectF &e = cache->exposed[i];
        if (!rect.isNull() && !e.intersects(rect))
            continue;
        e.translate(dx, dy);
    }

    // Append newly exposed areas. Note that the exposed region is currently
    // in pixmap coordinates, so we have to translate it to item coordinates.
    exposed.translate(cache->boundingRect.topLeft());
    for (const QRect &exposedRect : exposed)
        cache->exposed += exposedRect;

    // Trigger update. This will redraw the newly exposed area and make sure
    // the pixmap is re-blitted in case there are overlapping items.
    d->scene->d_func()->markDirty(this, rect);
}